

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

size_t __thiscall
MADPComponentDiscreteActions::ConstructJointActionsRecursively
          (MADPComponentDiscreteActions *this,Index curAgentI,JointActionDiscrete *ja,Index jaI)

{
  ActionDiscrete *a;
  pointer pvVar1;
  ActionDiscrete *pAVar2;
  ActionDiscrete *pAVar3;
  pointer puVar4;
  pointer puVar5;
  JointActionDiscrete *this_00;
  JointActionDiscrete *this_01;
  size_t sVar6;
  ostream *poVar7;
  E *pEVar8;
  Index jaI_00;
  long lVar9;
  ulong uVar10;
  JointActionDiscrete *p_ja;
  ostream local_1a8 [376];
  
  sVar6 = (size_t)jaI;
  pvVar1 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (ulong)curAgentI;
  if ((ulong)(((long)(this->_m_actionVecs).
                     super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar10) {
    std::__cxx11::stringstream::stringstream((stringstream *)&p_ja);
    poVar7 = std::operator<<(local_1a8,"ConstructJointActionsRecursively - current Agent index (");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar7 = std::operator<<(poVar7,") out of bounds! (_m_actionVecs contains actions for ");
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::operator<<(poVar7," agents...)\n");
    pEVar8 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar8,(stringstream *)&p_ja);
    __cxa_throw(pEVar8,&E::typeinfo,E::~E);
  }
  pAVar2 = pvVar1[uVar10].super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar3 = *(pointer *)
            ((long)&pvVar1[uVar10].
                    super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (pAVar2 == pAVar3) {
    std::__cxx11::stringstream::stringstream((stringstream *)&p_ja);
    poVar7 = std::operator<<(local_1a8,"ERROR empty action set for agent ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    pEVar8 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar8,(stringstream *)&p_ja);
    __cxa_throw(pEVar8,&E::typeinfo,E::~E);
  }
  puVar4 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar5 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = (JointActionDiscrete *)operator_new(0x48);
  JointActionDiscrete::JointActionDiscrete(this_00,ja);
  lVar9 = 0;
  while( true ) {
    a = (ActionDiscrete *)
        ((long)&(pAVar2->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity + lVar9
        );
    jaI_00 = (Index)sVar6;
    if (a == pAVar3) break;
    this_01 = ja;
    if ((lVar9 != 0) && (this_01 = this_00, a != pAVar3 + -1)) {
      this_01 = (JointActionDiscrete *)operator_new(0x48);
      JointActionDiscrete::JointActionDiscrete(this_01,this_00);
    }
    p_ja = this_01;
    if (((long)puVar4 - (long)puVar5 >> 3) - 1U == uVar10) {
      (this_01->super_DiscreteEntity)._m_index = jaI_00;
      JointActionDiscrete::AddIndividualAction(this_01,a,curAgentI);
      std::vector<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>::push_back
                (&this->_m_jointActionVec,&p_ja);
      sVar6 = (size_t)(jaI_00 + 1);
    }
    else {
      JointActionDiscrete::AddIndividualAction(this_01,a,curAgentI);
      sVar6 = ConstructJointActionsRecursively(this,curAgentI + 1,p_ja,jaI_00);
    }
    lVar9 = lVar9 + 0x58;
  }
  return sVar6 & 0xffffffff;
}

Assistant:

size_t MADPComponentDiscreteActions::ConstructJointActionsRecursively(
    Index curAgentI, JointActionDiscrete& ja, Index jaI)
{

    bool lastAgent=false;
    if(curAgentI == _m_nrActions.size()-1)
    {
        lastAgent = true;    
    }
    if(curAgentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "ConstructJointActionsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }

    ActionDVec::iterator first = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator it = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator last = _m_actionVecs[curAgentI].end();
    ActionDVec::iterator beforelast = _m_actionVecs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss; ss << "ERROR empty action set for agent " << curAgentI;
        throw E(ss);
    }
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
        
    while( it != last) // other actions extend duplicates of ja
    {
        if(DEBUG_CJA)    cerr << "\nnext action";
            if(it == first) //
            {
                if(DEBUG_CJA)        
                    cerr << "(first action - not making copy)\n";
                p_ja = &ja;
            }
        else if (it == beforelast)//this is the last valid it -> last action   
        {
            if(DEBUG_CJA)        cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "
                << jaI <<endl;
        }
        ActionDiscrete* ai = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)cerr <<"Adding agent's indiv. action to joint action..."
            <<endl;
        p_ja->AddIndividualAction(ai, curAgentI);
        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = ConstructJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
        it++;
    }
    if(DEBUG_CJA)    
        cerr << ">>ProblemDecTiger::ConstructJointActionsRecursively(Index "<<
            curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"
            <<endl;
    return jaI;
}